

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_window.c
# Opt level: O1

zip_int64_t
window_read(zip_source_t *src,void *_ctx,void *data,zip_uint64_t len,zip_source_cmd_t cmd)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  zip_uint64_t zVar4;
  ulong uVar5;
  zip_int64_t zVar6;
  long lVar7;
  uint se;
  zip_int64_t *pzVar8;
  ulong uVar9;
  zip_uint8_t b [8192];
  undefined1 auStack_2038 [8200];
  
  switch(cmd) {
  case ZIP_SOURCE_OPEN:
    if (*(zip_t **)((long)_ctx + 0x18) != (zip_t *)0x0) {
      zVar4 = _zip_file_get_offset
                        (*(zip_t **)((long)_ctx + 0x18),*(zip_uint64_t *)((long)_ctx + 0x20),
                         (zip_error_t *)((long)_ctx + 0x98));
      if (zVar4 == 0) {
        return -1;
      }
      if (CARRY8(*(ulong *)((long)_ctx + 8),zVar4)) {
        se = 0x7fffff04;
        if (*(ulong *)((long)_ctx + 0x20) < 0x800000) {
          se = (int)*(ulong *)((long)_ctx + 0x20) << 8 | 4;
        }
        zip_error_set((zip_error_t *)((long)_ctx + 0x98),0x15,se);
        return -1;
      }
      *(zip_uint64_t *)_ctx = *_ctx + zVar4;
      *(ulong *)((long)_ctx + 8) = *(ulong *)((long)_ctx + 8) + zVar4;
      *(undefined8 *)((long)_ctx + 0x18) = 0;
    }
    if ((*(char *)((long)_ctx + 0xb0) == '\0') && (uVar5 = *_ctx, uVar5 != 0)) {
      uVar9 = 0;
      do {
        zVar4 = uVar5 - uVar9;
        if (0x1fff < zVar4) {
          zVar4 = 0x2000;
        }
        zVar6 = zip_source_read(src,auStack_2038,zVar4);
        if (zVar6 < 0) goto LAB_00111f90;
        if (zVar6 == 0) goto LAB_00111e03;
        uVar9 = uVar9 + zVar6;
        uVar5 = *_ctx;
      } while (uVar9 < uVar5);
    }
    lVar7 = *_ctx;
    break;
  case ZIP_SOURCE_READ:
    if ((*(char *)((long)_ctx + 0x10) == '\x01') &&
       (uVar5 = *(long *)((long)_ctx + 8) - *(long *)((long)_ctx + 0x28), uVar5 < len)) {
      len = uVar5;
    }
    if (len == 0) {
      return 0;
    }
    if ((*(char *)((long)_ctx + 0xb0) == '\x01') &&
       (iVar3 = zip_source_seek(src,*(zip_int64_t *)((long)_ctx + 0x28),0), iVar3 < 0)) {
LAB_00111f90:
      zip_error_set_from_source((zip_error_t *)((long)_ctx + 0x98),src);
      return -1;
    }
    zVar6 = zip_source_read(src,data,len);
    if (-1 < zVar6) {
      uVar5 = *(long *)((long)_ctx + 0x28) + zVar6;
      *(ulong *)((long)_ctx + 0x28) = uVar5;
      if (zVar6 != 0) {
        return zVar6;
      }
      if (*(char *)((long)_ctx + 0x10) != '\x01') {
        return 0;
      }
      if (*(ulong *)((long)_ctx + 8) <= uVar5) {
        return 0;
      }
    }
LAB_00111e03:
    iVar3 = 0x11;
    goto LAB_00111ed5;
  case ZIP_SOURCE_CLOSE:
    goto LAB_0011200f;
  case ZIP_SOURCE_STAT:
    iVar3 = _zip_stat_merge((zip_stat_t *)data,(zip_stat_t *)((long)_ctx + 0x30),
                            (zip_error_t *)((long)_ctx + 0x98));
    if (iVar3 < 0) {
      return -1;
    }
    if ((((zip_stat_t *)((long)_ctx + 0x30))->valid & 4) == 0) {
      if (*(char *)((long)_ctx + 0x10) == '\x01') {
        *(ulong *)data = *data | 4;
        *(long *)((long)data + 0x18) = *(long *)((long)_ctx + 8) - *_ctx;
      }
      else if ((*data & 4) != 0) {
        *(long *)((long)data + 0x18) = *(long *)((long)data + 0x18) - *_ctx;
      }
    }
    *(ulong *)data = *data & ~*(ulong *)((long)_ctx + 0x70);
    return 0;
  case ZIP_SOURCE_ERROR:
    zVar6 = zip_error_to_data((zip_error_t *)((long)_ctx + 0x98),data,len);
    return zVar6;
  case ZIP_SOURCE_FREE:
    free(_ctx);
    return 0;
  case ZIP_SOURCE_SEEK:
    if (*(char *)((long)_ctx + 0x10) == '\0') {
      pzVar8 = (zip_int64_t *)data;
      if (len < 0x10) {
        pzVar8 = (zip_int64_t *)0x0;
        zip_error_set((zip_error_t *)((long)_ctx + 0x98),0x12,0);
      }
      zVar6 = -1;
      if (pzVar8 == (zip_int64_t *)0x0) {
LAB_00111fd2:
        bVar2 = false;
      }
      else if ((int)pzVar8[1] == 2) {
        iVar3 = zip_source_seek(src,*pzVar8,2);
        if ((iVar3 < 0) || (uVar5 = zip_source_tell(src), (long)uVar5 < 0)) {
          zip_error_set_from_source((zip_error_t *)((long)_ctx + 0x98),src);
          goto LAB_00111fd2;
        }
        if (uVar5 < *_ctx) {
          bVar2 = false;
          zip_error_set((zip_error_t *)((long)_ctx + 0x98),0x12,0);
          zip_source_seek(src,*(zip_int64_t *)((long)_ctx + 0x28),0);
        }
        else {
          *(ulong *)((long)_ctx + 0x28) = uVar5;
          bVar2 = false;
          zVar6 = 0;
        }
      }
      else {
        bVar2 = true;
      }
      if (!bVar2) {
        return zVar6;
      }
    }
    zVar6 = zip_source_seek_compute_offset
                      (*(long *)((long)_ctx + 0x28) - *_ctx,*(long *)((long)_ctx + 8) - *_ctx,data,
                       len,(zip_error_t *)((long)_ctx + 0x98));
    if (zVar6 < 0) {
      return -1;
    }
    lVar7 = zVar6 + *_ctx;
    break;
  case ZIP_SOURCE_TELL:
    return *(long *)((long)_ctx + 0x28) - *_ctx;
  default:
    zVar6 = zip_source_pass_to_lower_layer(src,data,len,cmd);
    return zVar6;
  case ZIP_SOURCE_SUPPORTS:
    return *(zip_int64_t *)((long)_ctx + 0xa8);
  case ZIP_SOURCE_GET_FILE_ATTRIBUTES:
    if (0x17 < len) {
      *(undefined8 *)((long)data + 0x10) = *(undefined8 *)((long)_ctx + 0x88);
      uVar1 = *(undefined8 *)((long)_ctx + 0x80);
      *(undefined8 *)data = *(undefined8 *)((long)_ctx + 0x78);
      *(undefined8 *)((long)data + 8) = uVar1;
      return 0x18;
    }
    goto LAB_00111ec6;
  case ZIP_SOURCE_GET_DOS_TIME:
    if (3 < len) {
      if (*(char *)((long)_ctx + 0x94) != '\x01') {
        return 0;
      }
      *(undefined4 *)data = *(undefined4 *)((long)_ctx + 0x90);
      return 4;
    }
LAB_00111ec6:
    iVar3 = 0x12;
LAB_00111ed5:
    zip_error_set((zip_error_t *)((long)_ctx + 0x98),iVar3,0);
    return -1;
  }
  *(long *)((long)_ctx + 0x28) = lVar7;
LAB_0011200f:
  return 0;
}

Assistant:

static zip_int64_t
window_read(zip_source_t *src, void *_ctx, void *data, zip_uint64_t len, zip_source_cmd_t cmd) {
    struct window *ctx;
    zip_int64_t ret;
    zip_uint64_t n, i;

    ctx = (struct window *)_ctx;

    switch (cmd) {
    case ZIP_SOURCE_CLOSE:
        return 0;

    case ZIP_SOURCE_ERROR:
        return zip_error_to_data(&ctx->error, data, len);

    case ZIP_SOURCE_FREE:
        free(ctx);
        return 0;

    case ZIP_SOURCE_OPEN:
        if (ctx->source_archive) {
            zip_uint64_t offset;

            if ((offset = _zip_file_get_offset(ctx->source_archive, ctx->source_index, &ctx->error)) == 0) {
                return -1;
            }
            if (ctx->end + offset < ctx->end) {
                /* zip archive data claims end of data past zip64 limits */
                zip_error_set(&ctx->error, ZIP_ER_INCONS, MAKE_DETAIL_WITH_INDEX(ZIP_ER_DETAIL_CDIR_ENTRY_INVALID, ctx->source_index));
                return -1;
            }
            ctx->start += offset;
            ctx->end += offset;
            ctx->source_archive = NULL;
        }

        if (!ctx->needs_seek) {
            DEFINE_BYTE_ARRAY(b, BUFSIZE);

            if (!byte_array_init(b, BUFSIZE)) {
                zip_error_set(&ctx->error, ZIP_ER_MEMORY, 0);
                return -1;
            }

            for (n = 0; n < ctx->start; n += (zip_uint64_t)ret) {
                i = (ctx->start - n > BUFSIZE ? BUFSIZE : ctx->start - n);
                if ((ret = zip_source_read(src, b, i)) < 0) {
                    zip_error_set_from_source(&ctx->error, src);
                    byte_array_fini(b);
                    return -1;
                }
                if (ret == 0) {
                    zip_error_set(&ctx->error, ZIP_ER_EOF, 0);
                    byte_array_fini(b);
                    return -1;
                }
            }

            byte_array_fini(b);
        }

        ctx->offset = ctx->start;
        return 0;

    case ZIP_SOURCE_READ:
        if (ctx->end_valid && len > ctx->end - ctx->offset) {
            len = ctx->end - ctx->offset;
        }

        if (len == 0) {
            return 0;
        }

        if (ctx->needs_seek) {
            if (zip_source_seek(src, (zip_int64_t)ctx->offset, SEEK_SET) < 0) {
                zip_error_set_from_source(&ctx->error, src);
                return -1;
            }
        }

        if ((ret = zip_source_read(src, data, len)) < 0) {
            zip_error_set(&ctx->error, ZIP_ER_EOF, 0);
            return -1;
        }

        ctx->offset += (zip_uint64_t)ret;

        if (ret == 0) {
            if (ctx->end_valid && ctx->offset < ctx->end) {
                zip_error_set(&ctx->error, ZIP_ER_EOF, 0);
                return -1;
            }
        }
        return ret;

    case ZIP_SOURCE_SEEK: {
        zip_int64_t new_offset;
        
        if (!ctx->end_valid) {
            zip_source_args_seek_t *args = ZIP_SOURCE_GET_ARGS(zip_source_args_seek_t, data, len, &ctx->error);
            
            if (args == NULL) {
                return -1;
            }
            if (args->whence == SEEK_END) {
                if (zip_source_seek(src, args->offset, args->whence) < 0) {
                    zip_error_set_from_source(&ctx->error, src);
                    return -1;
                }
                new_offset = zip_source_tell(src);
                if (new_offset < 0) {
                    zip_error_set_from_source(&ctx->error, src);
                    return -1;
                }
                if ((zip_uint64_t)new_offset < ctx->start) {
                    zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
                    (void)zip_source_seek(src, (zip_int64_t)ctx->offset, SEEK_SET);
                    return -1;
                }
                ctx->offset = (zip_uint64_t)new_offset;
                return 0;
            }
        }

        new_offset = zip_source_seek_compute_offset(ctx->offset - ctx->start, ctx->end - ctx->start, data, len, &ctx->error);
        
        if (new_offset < 0) {
            return -1;
        }
        
        ctx->offset = (zip_uint64_t)new_offset + ctx->start;
        return 0;
    }

    case ZIP_SOURCE_STAT: {
        zip_stat_t *st;

        st = (zip_stat_t *)data;

        if (_zip_stat_merge(st, &ctx->stat, &ctx->error) < 0) {
            return -1;
        }

        if (!(ctx->stat.valid & ZIP_STAT_SIZE)) {
            if (ctx->end_valid) {
                st->valid |= ZIP_STAT_SIZE;
                st->size = ctx->end - ctx->start;
            }
            else if (st->valid & ZIP_STAT_SIZE) {
                st->size -= ctx->start;
            }
        }

        st->valid &= ~ctx->stat_invalid;

        return 0;
    }

    case ZIP_SOURCE_GET_FILE_ATTRIBUTES:
        if (len < sizeof(ctx->attributes)) {
            zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
            return -1;
        }

        (void)memcpy_s(data, sizeof(ctx->attributes), &ctx->attributes, sizeof(ctx->attributes));
        return sizeof(ctx->attributes);

    case ZIP_SOURCE_GET_DOS_TIME:
        if (len < sizeof(ctx->dostime)) {
            zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
            return -1;
        }
        if (ctx->dostime_valid) {
            (void)memcpy_s(data, sizeof(ctx->dostime), &ctx->dostime, sizeof(ctx->dostime));
            return sizeof(ctx->dostime);
        }
        else {
            return 0;
        }

    case ZIP_SOURCE_SUPPORTS:
        return ctx->supports;

    case ZIP_SOURCE_TELL:
        return (zip_int64_t)(ctx->offset - ctx->start);

    default:
        return zip_source_pass_to_lower_layer(src, data, len, cmd);
    }
}